

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoundFunction.cpp
# Opt level: O1

JavascriptFunction * __thiscall Js::BoundFunction::GetTargetFunction(BoundFunction *this)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  JavascriptProxy *this_00;
  RecyclableObject *obj;
  JavascriptFunction *pJVar4;
  undefined4 *puVar5;
  undefined7 extraout_var;
  
  obj = (this->targetFunction).ptr;
  if (obj != (RecyclableObject *)0x0) {
    while (bVar2 = VarIs<Js::JavascriptProxy,Js::RecyclableObject>(obj), bVar2) {
      this_00 = VarTo<Js::JavascriptProxy,Js::RecyclableObject>(obj);
      obj = JavascriptProxy::GetTarget(this_00);
    }
    bVar2 = VarIsImpl<Js::JavascriptFunction>(obj);
    if (bVar2) {
      pJVar4 = VarTo<Js::JavascriptFunction,Js::RecyclableObject>(obj);
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/BoundFunction.cpp"
                                  ,0x101,"(0)","FALSE");
      pJVar4 = (JavascriptFunction *)CONCAT71(extraout_var,bVar3);
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    if (bVar2) {
      return pJVar4;
    }
  }
  return (JavascriptFunction *)0x0;
}

Assistant:

JavascriptFunction * BoundFunction::GetTargetFunction() const
    {
        if (targetFunction != nullptr)
        {
            RecyclableObject* _targetFunction = targetFunction;
            while (VarIs<JavascriptProxy>(_targetFunction))
            {
                _targetFunction = VarTo<JavascriptProxy>(_targetFunction)->GetTarget();
            }

            if (VarIs<JavascriptFunction>(_targetFunction))
            {
                return VarTo<JavascriptFunction>(_targetFunction);
            }

            // targetFunction should always be a JavascriptFunction.
            Assert(FALSE);
        }
        return nullptr;
    }